

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O1

void __thiscall Scine::Core::ModuleManager::Impl::Impl(Impl *this)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  error_category *peVar5;
  int iVar6;
  char *__s;
  size_t sVar7;
  pointer pbVar8;
  bool bVar9;
  string modulePath;
  error_code ec;
  path coreLocationParent;
  path executableParentPath;
  string local_110;
  undefined1 *local_f0;
  error_category *local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined1 *local_d0;
  error_category *local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 local_b0;
  system_error_category *local_a8;
  long local_a0 [2];
  undefined1 *local_90;
  path local_88;
  path local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::dll::program_location();
  boost::filesystem::path::parent_path();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  tryLoadModulesInPath(this,&local_68);
  tryAdjacentDirectories(this,&local_68);
  local_d0 = &local_c0;
  local_c8 = (error_category *)0x0;
  local_c0 = 0;
  local_b0 = (long *)((ulong)local_b0._5_3_ << 0x28);
  local_a8 = &boost::system::detail::cat_holder<void>::system_category_instance;
  local_f0 = &local_e0;
  local_e8 = (error_category *)0x0;
  local_e0 = 0;
  local_90 = local_f0;
  iVar6 = dladdr(boost::dll::anon_unknown_3::this_line_location);
  peVar5 = local_e8;
  _Var4._M_p = local_110._M_dataplus._M_p;
  if (iVar6 == 0) {
    dlerror();
    local_b0 = (long *)0x10000000e;
    local_a8 = (system_error_category *)
               &boost::system::detail::cat_holder<void>::generic_category_instance;
  }
  else {
    strlen(local_110._M_dataplus._M_p);
    std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)peVar5,(ulong)_Var4._M_p);
  }
  std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_b0._4_1_ == true) {
    boost::dll::detail::report_error
              ((error_code *)&local_b0,"boost::dll::this_line_location() failed");
  }
  boost::filesystem::path::parent_path();
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  tryLoadModulesInPath(this,&local_88);
  boost::filesystem::path::parent_path();
  boost::filesystem::path::parent_path();
  iVar6 = boost::filesystem::path::compare((path *)&local_110);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    tryAdjacentDirectories(this,&local_88);
  }
  __s = getenv("SCINE_MODULE_PATH");
  if (__s != (char *)0x0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,__s + sVar7);
    Detail::split(&local_48,&local_110,':');
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar8 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        sVar1 = pbVar8->_M_string_length;
        if (sVar1 == 0) {
LAB_0010d28e:
          bVar3 = false;
          bVar9 = false;
        }
        else {
          local_f0 = &local_e0;
          pcVar2 = (pbVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar2,pcVar2 + pbVar8->_M_string_length);
          boost::filesystem::detail::status((path *)&local_b0,(error_code *)&local_f0);
          if ((uint)local_b0 < 2) goto LAB_0010d28e;
          local_d0 = &local_c0;
          pcVar2 = (pbVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,pcVar2 + pbVar8->_M_string_length);
          boost::filesystem::detail::status((path *)&local_b0,(error_code *)&local_d0);
          bVar9 = (uint)local_b0 == 3;
          bVar3 = true;
        }
        if ((bVar3) && (local_d0 != &local_c0)) {
          operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
        }
        if ((sVar1 != 0) && (local_f0 != &local_e0)) {
          operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
        }
        if (bVar9) {
          local_b0 = local_a0;
          pcVar2 = (pbVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,pcVar2 + pbVar8->_M_string_length);
          tryLoadModulesInPath(this,(path *)&local_b0);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_pathname._M_dataplus._M_p != &local_88.m_pathname.field_2) {
    operator_delete(local_88.m_pathname._M_dataplus._M_p,
                    local_88.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_pathname._M_dataplus._M_p != &local_68.m_pathname.field_2) {
    operator_delete(local_68.m_pathname._M_dataplus._M_p,
                    local_68.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Impl() {
    /* Try to load modules in several paths: */
    const auto executableParentPath = boost::dll::program_location().parent_path();
    tryLoadModulesInPath(executableParentPath);
    tryAdjacentDirectories(executableParentPath);
    const auto coreLocationParent = boost::dll::this_line_location().parent_path();
    tryLoadModulesInPath(coreLocationParent);
    if (coreLocationParent.parent_path() != executableParentPath.parent_path()) {
      tryAdjacentDirectories(coreLocationParent);
    }

    // SCINE_MODULE_PATH environment variable. Path separators are os-dependent!
#ifdef _WIN32
    const char pathSep = ';';
#else
    const char pathSep = ':';
#endif

    if (const char* pathPtr = std::getenv("SCINE_MODULE_PATH")) {
      std::string modulePath = pathPtr;

      for (const auto& singlePath : Detail::split(modulePath, pathSep)) {
        if (!singlePath.empty() && boost::filesystem::exists(singlePath) && boost::filesystem::is_directory(singlePath)) {
          tryLoadModulesInPath(singlePath);
        }
      }
    }
  }